

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O0

bool __thiscall
DIS::RecordSpecification::operator==(RecordSpecification *this,RecordSpecification *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  RecordSpecification *rhs_local;
  RecordSpecification *this_local;
  
  idx._7_1_ = true;
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
            ::size(&this->_recordSets);
    if (sVar2 <= local_28) break;
    this_00 = std::
              vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
              ::operator[](&this->_recordSets,local_28);
    rhs_00 = std::
             vector<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
             ::operator[](&rhs->_recordSets,local_28);
    bVar1 = RecordSpecificationElement::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool RecordSpecification::operator ==(const RecordSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _recordSets.size(); idx++)
     {
        if( ! ( _recordSets[idx] == rhs._recordSets[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }